

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O3

void setup::anon_unknown_21::load_wizard_images
               (istream *is,version *version,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *images,entry_types entries)

{
  pointer __pos;
  long lVar1;
  ulong __new_size;
  char buffer [4];
  uint local_2c;
  
  if (version->value < 0x5060000) {
    __new_size = 1;
    if (((ulong)entries._flags.super__Base_bitset<1UL>._M_w & 0x90000) == 0) goto LAB_0013a043;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(images,1);
  }
  else {
    std::istream::read((char *)is,(long)&local_2c);
    __new_size = (ulong)local_2c;
    if (((ulong)entries._flags.super__Base_bitset<1UL>._M_w & 0x90000) == 0) {
      if (__new_size == 0) {
        return;
      }
LAB_0013a043:
      do {
        util::binary_string::skip(is);
        __new_size = __new_size - 1;
      } while (__new_size != 0);
      return;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(images,__new_size);
    if (__new_size == 0) goto LAB_0013a020;
  }
  lVar1 = 0;
  do {
    util::binary_string::load
              (is,(string *)
                  ((long)&(((images->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar1))
    ;
    lVar1 = lVar1 + 0x20;
    __new_size = __new_size - 1;
  } while (__new_size != 0);
LAB_0013a020:
  if ((version->value < 0x5060000) &&
     (__pos = (images->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start, __pos->_M_string_length == 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(images,__pos);
  }
  return;
}

Assistant:

void load_wizard_images(std::istream & is, const setup::version & version,
                        std::vector<std::string> & images, info::entry_types entries) {
	
	size_t count = 1;
	if(version >= INNO_VERSION(5, 6, 0)) {
		count = util::load<boost::uint32_t>(is);
	}
	
	if(entries & (info::WizardImages | info::NoSkip)) {
		images.resize(count);
		for(size_t i = 0; i < count; i++) {
			is >> util::binary_string(images[i]);
		}
		if(version < INNO_VERSION(5, 6, 0) && images[0].empty()) {
			images.clear();
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			util::binary_string::skip(is);
		}
	}
	
}